

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O1

int __thiscall trng::negative_binomial_dist::operator()(negative_binomial_dist *this,lcg64_shift *r)

{
  double *pdVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint x;
  ulong uVar7;
  double dVar8;
  double local_18;
  
  uVar3 = (r->S).r * (r->P).a + (r->P).b;
  uVar4 = uVar3 >> 0x11 ^ uVar3;
  uVar4 = uVar4 << 0x1f ^ uVar4;
  (r->S).r = uVar3;
  local_18 = (double)(uVar4 >> 1 ^ uVar4 >> 9) * 1.0842021724855042e-19;
  pdVar1 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (*pdVar1 <= local_18) {
    lVar5 = (long)pdVar2 - (long)pdVar1 >> 3;
    uVar3 = lVar5 - 1;
    if (2 < lVar5) {
      uVar4 = 0;
      do {
        uVar7 = (long)(uVar4 + uVar3) / 2;
        uVar6 = uVar7;
        if (local_18 <= pdVar1[uVar7]) {
          uVar6 = uVar4;
          uVar3 = uVar7;
        }
        uVar4 = uVar6;
      } while (1 < (long)(uVar3 - uVar6));
    }
  }
  else {
    uVar3 = 0;
  }
  if (uVar3 + 1 == (long)pdVar2 - (long)pdVar1 >> 3) {
    dVar8 = param_type::cdf(&this->P,(int)uVar3);
    while (local_18 = local_18 - dVar8, 0.0 < local_18) {
      x = (int)uVar3 + 1;
      uVar3 = (ulong)x;
      dVar8 = param_type::pdf(&this->P,x);
    }
  }
  return (int)uVar3;
}

Assistant:

int operator()(R &r) {
      double p{utility::uniformco<double>(r)};
      const std::size_t x{utility::discrete(p, P.P_.begin(), P.P_.end())};
      int x_i{static_cast<int>(x)};
      if (x + 1 == P.P_.size()) {
        p -= cdf(x_i);
        while (p > 0) {
          ++x_i;
          p -= pdf(x_i);
        }
      }
      return x_i;
    }